

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerSync(Pager *pPager,char *zMaster)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  int iVar3;
  
  psVar1 = pPager->fd->pMethods;
  if (psVar1 == (sqlite3_io_methods *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar2 = (*psVar1->xFileControl)(pPager->fd,0x15,zMaster);
    iVar3 = 0;
    if (iVar2 != 0xc) {
      iVar3 = iVar2;
    }
  }
  if ((iVar3 == 0) && (iVar3 = 0, pPager->noSync == '\0')) {
    iVar3 = (*pPager->fd->pMethods->xSync)(pPager->fd,(int)pPager->syncFlags);
    return iVar3;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSync(Pager *pPager, const char *zMaster){
  int rc = SQLITE_OK;

  if( isOpen(pPager->fd) ){
    void *pArg = (void*)zMaster;
    rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_SYNC, pArg);
    if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
  }
  if( rc==SQLITE_OK && !pPager->noSync ){
    assert( !MEMDB );
    rc = sqlite3OsSync(pPager->fd, pPager->syncFlags);
  }
  return rc;
}